

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBackwardCompatibility.cpp
# Opt level: O0

void anon_unknown.dwarf_2bc81::addUserAttributesToHeader(Header *hdr)

{
  char *in_RDI;
  V3d a19;
  V2d a18;
  M44d a17;
  M33d a16;
  StringVector a15;
  Chromaticities a13;
  double a12;
  V3f a11;
  V3i a10;
  V2f a9;
  V2i a8;
  string a7;
  M44f a6;
  M33f a5;
  int a4;
  float a3;
  Box2f a2;
  Box2i a1;
  undefined8 in_stack_fffffffffffff908;
  undefined4 uVar1;
  value_type *__x;
  Vec2<float> *in_stack_fffffffffffff910;
  undefined4 uVar2;
  Vec2<float> *in_stack_fffffffffffff918;
  Box<Imath_3_2::Vec2<float>_> *in_stack_fffffffffffff920;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  undefined8 in_stack_fffffffffffff940;
  undefined4 uVar4;
  allocator<char> *__a;
  char *in_stack_fffffffffffff948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff950;
  char *pcVar5;
  Vec3 local_5b0 [32];
  Vec2 local_590 [24];
  Matrix44 local_578 [136];
  Matrix33 local_4f0 [80];
  vector local_4a0 [32];
  Chromaticities local_480 [40];
  TypedAttribute<double> local_458 [16];
  Vec3 local_448 [24];
  Vec3 local_430 [24];
  Vec2 local_418 [16];
  Vec2 local_408 [16];
  string local_3f8 [40];
  Matrix44 local_3d0 [72];
  Matrix33 local_388 [48];
  TypedAttribute<int> local_358 [16];
  TypedAttribute<float> local_348 [16];
  Box local_338 [24];
  Box local_320 [24];
  Vec3<double> local_308;
  Vec2<double> local_2f0;
  Matrix44<double> local_2e0;
  Matrix33<double> local_260;
  allocator<char> local_211;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [56];
  Vec2<float> local_160;
  Vec2<float> local_158;
  Vec2<float> local_150;
  Vec2<float> local_148;
  Chromaticities local_140 [32];
  undefined8 local_120;
  Vec3<float> local_114;
  Vec3<int> local_108;
  Vec2<float> local_fc;
  Vec2<int> local_f4 [3];
  allocator<char> local_d9;
  string local_d8 [36];
  Matrix44<float> local_b4;
  Matrix33<float> local_74;
  undefined4 local_50;
  undefined4 local_4c;
  Vec2<float> local_48;
  Vec2<float> local_40 [3];
  Vec2<int> local_28;
  Vec2<int> local_20 [3];
  char *local_8;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffff940 >> 0x20);
  uVar1 = (undefined4)((ulong)in_stack_fffffffffffff908 >> 0x20);
  local_8 = in_RDI;
  Imath_3_2::Vec2<int>::Vec2(local_20,1,2);
  Imath_3_2::Vec2<int>::Vec2(&local_28,3,4);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffff920,
             (Vec2<int> *)in_stack_fffffffffffff918,(Vec2<int> *)in_stack_fffffffffffff910);
  Imath_3_2::Vec2<float>::Vec2(local_40,1.5,2.5);
  Imath_3_2::Vec2<float>::Vec2(&local_48,3.5,4.5);
  Imath_3_2::Box<Imath_3_2::Vec2<float>_>::Box
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffff910 >> 0x20);
  local_4c = 0x40490fd0;
  local_50 = 0x11;
  Imath_3_2::Matrix33<float>::Matrix33(&local_74,11.0,12.0,13.0,14.0,15.0,16.0,17.0,18.0,19.0);
  __a = (allocator<char> *)CONCAT44(uVar4,0x41800000);
  pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(uVar2,0x41200000);
  __x = (value_type *)CONCAT44(uVar1,0x41100000);
  Imath_3_2::Matrix44<float>::Matrix44
            (&local_b4,1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0,11.0,12.0,13.0,14.0,15.0,16.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948,__a);
  std::allocator<char>::~allocator(&local_d9);
  Imath_3_2::Vec2<int>::Vec2(local_f4,0x1b,0x1c);
  Imath_3_2::Vec2<float>::Vec2(&local_fc,27.5,28.5);
  Imath_3_2::Vec3<int>::Vec3(&local_108,0x25,0x26,0x27);
  Imath_3_2::Vec3<float>::Vec3(&local_114,37.5,38.5,39.5);
  local_120 = 0x401c7e62b51e06e0;
  Imath_3_2::Vec2<float>::Vec2(&local_148,1.0,2.0);
  Imath_3_2::Vec2<float>::Vec2(&local_150,3.0,4.0);
  Imath_3_2::Vec2<float>::Vec2(&local_158,5.0,6.0);
  Imath_3_2::Vec2<float>::Vec2(&local_160,7.0,8.0);
  Imf_3_4::Chromaticities::Chromaticities
            (local_140,(Vec2 *)&local_148,(Vec2 *)&local_150,(Vec2 *)&local_158,(Vec2 *)&local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1400c3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948,__a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pvVar3,__x);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948,__a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pvVar3,__x);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948,__a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pvVar3,__x);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948,__a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pvVar3,__x);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  Imath_3_2::Matrix33<double>::Matrix33(&local_260,12.0,13.0,14.0,15.0,16.0,17.0,18.0,19.0,20.0);
  pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x402a000000000000;
  Imath_3_2::Matrix44<double>::Matrix44
            (&local_2e0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0,11.0,12.0,13.0,14.0,15.0,16.0,17.0);
  Imath_3_2::Vec2<double>::Vec2(&local_2f0,27.51,28.51);
  Imath_3_2::Vec3<double>::Vec3(&local_308,37.51,38.51,39.51);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::TypedAttribute(local_320);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224d8e);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>> *)local_320);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::TypedAttribute(local_338);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224e21);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>> *)local_338);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<float>::TypedAttribute((float *)local_348);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224e5a);
  Imf_3_4::TypedAttribute<float>::~TypedAttribute(local_348);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<int>::TypedAttribute((int *)local_358);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224e91);
  Imf_3_4::TypedAttribute<int>::~TypedAttribute(local_358);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::TypedAttribute(local_388);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224ec9);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix33<float>> *)local_388);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::TypedAttribute(local_3d0);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224f01);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<float>> *)local_3d0);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute(local_3f8);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224f3b);
  Imf_3_4::TypedAttribute<std::__cxx11::string>::~TypedAttribute
            ((TypedAttribute<std::__cxx11::string> *)local_3f8);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>::TypedAttribute(local_408);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224f72);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<int>> *)local_408);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>::TypedAttribute(local_418);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224fa9);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<float>> *)local_418);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>::TypedAttribute(local_430);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x224fe1);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<int>> *)local_430);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>::TypedAttribute(local_448);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x22501a);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<float>> *)local_448);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<double>::TypedAttribute((double *)local_458);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x225056);
  Imf_3_4::TypedAttribute<double>::~TypedAttribute(local_458);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute(local_480);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)"a13");
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::Chromaticities> *)local_480);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  TypedAttribute(local_4a0);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)"a15");
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  ~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   *)local_4a0);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<double>>::TypedAttribute(local_4f0);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x22537e);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix33<double>> *)local_4f0);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>>::TypedAttribute(local_578);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x2253b8);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<double>> *)local_578);
  pcVar5 = local_8;
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>>::TypedAttribute(local_590);
  Imf_3_4::Header::insert(pcVar5,(Attribute *)0x2253f1);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<double>> *)local_590);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>>::TypedAttribute(local_5b0);
  Imf_3_4::Header::insert(local_8,(Attribute *)0x22542a);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<double>> *)local_5b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(pvVar3);
  std::__cxx11::string::~string(local_d8);
  return;
}

Assistant:

void
addUserAttributesToHeader (OPENEXR_IMF_NAMESPACE::Header& hdr)
{
    Box2i          a1 (V2i (1, 2), V2i (3, 4));
    Box2f          a2 (V2f (1.5, 2.5), V2f (3.5, 4.5));
    float          a3 (3.14159);
    int            a4 (17);
    M33f           a5 (11, 12, 13, 14, 15, 16, 17, 18, 19);
    M44f           a6 (1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16);
    string         a7 ("extensive rebuilding by Nebuchadrezzar has left");
    V2i            a8 (27, 28);
    V2f            a9 (27.5, 28.5);
    V3i            a10 (37, 38, 39);
    V3f            a11 (37.5, 38.5, 39.5);
    double         a12 (7.12342341419);
    Chromaticities a13 (V2f (1, 2), V2f (3, 4), V2f (5, 6), V2f (7, 8));
    //    Envmap a14 (ENVMAP_CUBE);
    StringVector a15;
    a15.push_back ("who can spin");
    a15.push_back ("");
    a15.push_back ("straw into");
    a15.push_back ("gold");

    M33d a16 (12, 13, 14, 15, 16, 17, 18, 19, 20);
    M44d a17 (2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17);
    V2d  a18 (27.51, 28.51);
    V3d  a19 (37.51, 38.51, 39.51);

    hdr.insert ("a1", Box2iAttribute (a1));
    hdr.insert ("a2", Box2fAttribute (a2));
    hdr.insert ("a3", FloatAttribute (a3));
    hdr.insert ("a4", IntAttribute (a4));
    hdr.insert ("a5", M33fAttribute (a5));
    hdr.insert ("a6", M44fAttribute (a6));
    hdr.insert ("a7", StringAttribute (a7));
    hdr.insert ("a8", V2iAttribute (a8));
    hdr.insert ("a9", V2fAttribute (a9));
    hdr.insert ("a10", V3iAttribute (a10));
    hdr.insert ("a11", V3fAttribute (a11));
    hdr.insert ("a12", DoubleAttribute (a12));
    hdr.insert ("a13", ChromaticitiesAttribute (a13));
    //    hdr.insert ("a14", EnvmapAttribute         (a14));
    hdr.insert ("a15", StringVectorAttribute (a15));
    hdr.insert ("a16", M33dAttribute (a16));
    hdr.insert ("a17", M44dAttribute (a17));
    hdr.insert ("a18", V2dAttribute (a18));
    hdr.insert ("a19", V3dAttribute (a19));
}